

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_darea_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area,REF_DBL *d_area)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  REF_DBL d_normz [3];
  REF_DBL d_normy [3];
  REF_DBL d_normx [3];
  double local_78 [4];
  double local_58 [4];
  double local_38 [4];
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        uVar7 = (ulong)(uint)(iVar1 * 0xf);
        uVar8 = (ulong)(uVar3 * 0xf);
        uVar9 = (ulong)(uVar4 * 0xf);
        dVar16 = pRVar6[uVar8] - pRVar6[uVar7];
        dVar11 = pRVar6[uVar8 + 1] - pRVar6[uVar7 + 1];
        dVar17 = pRVar6[uVar8 + 2] - pRVar6[uVar7 + 2];
        dVar12 = pRVar6[uVar9] - pRVar6[uVar7];
        dVar13 = pRVar6[uVar9 + 1] - pRVar6[uVar7 + 1];
        dVar14 = pRVar6[uVar9 + 2] - pRVar6[uVar7 + 2];
        dVar15 = dVar11 * dVar14 - dVar13 * dVar17;
        local_38[0] = 0.0;
        local_38[1] = dVar17 - dVar14;
        local_38[2] = dVar13 - dVar11;
        dVar18 = dVar17 * dVar12 - dVar14 * dVar16;
        local_58[0] = dVar14 - dVar17;
        local_58[1] = 0.0;
        local_58[2] = dVar16 - dVar12;
        dVar14 = dVar16 * dVar13 - dVar12 * dVar11;
        local_78[0] = dVar11 - dVar13;
        local_78[1] = dVar12 - dVar16;
        local_78[2] = 0.0;
        dVar12 = dVar14 * dVar14 + dVar15 * dVar15 + dVar18 * dVar18;
        dVar11 = SQRT(dVar12);
        if (dVar12 < 0.0) {
          dVar11 = sqrt(dVar12);
        }
        *area = dVar11 * 0.5;
        lVar10 = 0;
        do {
          dVar11 = SQRT(dVar12);
          if (dVar12 < 0.0) {
            dVar11 = sqrt(dVar12);
          }
          d_area[lVar10] =
               (local_78[lVar10] * (dVar14 + dVar14) +
               local_38[lVar10] * (dVar15 + dVar15) + local_58[lVar10] * (dVar18 + dVar18)) *
               (0.25 / dVar11);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        return 0;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x955,
         "ref_node_tri_darea_dnode0",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_darea_dnode0(REF_NODE ref_node, REF_INT *nodes,
                                             REF_DBL *area, REF_DBL *d_area) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL v0[3], v1[3];
  REF_DBL normx, normy, normz;
  REF_DBL d_normx[3], d_normy[3], d_normz[3];
  REF_INT i;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  v0[0] = xyz1[0] - xyz0[0];
  v0[1] = xyz1[1] - xyz0[1];
  v0[2] = xyz1[2] - xyz0[2];

  v1[0] = xyz2[0] - xyz0[0];
  v1[1] = xyz2[1] - xyz0[1];
  v1[2] = xyz2[2] - xyz0[2];

  normx = (v0)[1] * (v1)[2] - (v0)[2] * (v1)[1];
  d_normx[0] = 0.0;
  d_normx[1] = -(v1)[2] + (v0)[2];
  d_normx[2] = -(v0)[1] + (v1)[1];

  normy = (v0)[2] * (v1)[0] - (v0)[0] * (v1)[2];
  d_normy[0] = -(v0)[2] + (v1)[2];
  d_normy[1] = 0.0;
  d_normy[2] = -(v1)[0] + (v0)[0];

  normz = (v0)[0] * (v1)[1] - (v0)[1] * (v1)[0];
  d_normz[0] = -(v1)[1] + (v0)[1];
  d_normz[1] = -(v0)[0] + (v1)[0];
  d_normz[2] = 0.0;

  *area = 0.5 * sqrt(normx * normx + normy * normy + normz * normz);
  for (i = 0; i < 3; i++)
    d_area[i] = 0.5 * 0.5 /
                sqrt(normx * normx + normy * normy + normz * normz) *
                (2.0 * normx * d_normx[i] + 2.0 * normy * d_normy[i] +
                 2.0 * normz * d_normz[i]);

  return REF_SUCCESS;
}